

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,(unsigned_char)2>(Thread *this)

{
  Value VVar1;
  
  VVar1 = Pop(this);
  Push(this,(Value)ZEXT116(VVar1.field_0._8_8_ != 0 && VVar1.field_0.i64_ != 0));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}